

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void writePic<PicHeaderSwitch>(ostream *stream,PicHeader *header,istream *reference)

{
  pointer pPVar1;
  PicChunk *chunk;
  pointer pPVar2;
  PicChunkSwitch local_4c;
  PicHeaderSwitch local_40;
  
  std::istream::seekg((long)reference,_S_beg);
  readRaw<PicHeaderSwitch>(&local_40,reference);
  local_40.filesize.value_ = (uchar  [4])header->filesize;
  local_40.ew.value_ = (uchar  [2])header->ew;
  local_40.eh.value_ = (uchar  [2])header->eh;
  local_40.width.value_ = (uchar  [2])header->width;
  local_40.height.value_ = (uchar  [2])header->height;
  local_40.chunks.value_ =
       SUB84(((long)(header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0xc,0);
  writeRaw<PicHeaderSwitch>(stream,&local_40);
  copyBytes(stream,reference,(uint)(2 < (uint)local_40.version.value_) << 2);
  pPVar1 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar2 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    local_4c.x.value_ = (uchar  [2])pPVar2->x;
    local_4c.y.value_ = (uchar  [2])pPVar2->y;
    local_4c.offset.value_ = (uchar  [4])pPVar2->offset;
    local_4c.size.value_ = (uchar  [4])pPVar2->size;
    writeRaw<PicChunkSwitch>(stream,&local_4c);
  }
  return;
}

Assistant:

void writePic(std::ostream& stream, const PicHeader& header, std::istream& reference) {
	reference.seekg(0, reference.beg);
	Header h = readRaw<Header>(reference);
	h.filesize = header.filesize;
	h.ew = header.ew;
	h.eh = header.eh;
	h.width = header.width;
	h.height = header.height;
	h.chunks = header.chunks.size();
	writeRaw(stream, h);
	copyBytes(stream, reference, h.bytesToSkip());
	for (const auto& chunk : header.chunks) {
		typename Header::Chunk c(chunk.x, chunk.y, chunk.offset, chunk.size);
		writeRaw(stream, c);
	}
}